

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.c
# Opt level: O2

void class6(int *ip)

{
  char last_char;
  int iVar1;
  long lVar2;
  int addr [3];
  
  loccnt = loccnt + 7;
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 3) {
      if (pass != 1) {
        return;
      }
      putbyte(data_loccnt,opval);
      putword(data_loccnt + 1,addr[0]);
      putword(data_loccnt + 3,addr[1]);
      putword(data_loccnt + 5,addr[2]);
      println();
      return;
    }
    last_char = ',';
    if (lVar2 == 2) {
      last_char = ';';
    }
    iVar1 = evaluate(ip,last_char);
    if (iVar1 == 0) break;
    if (0xffff < value && pass == 1) {
      error("Operand size error!");
      return;
    }
    addr[lVar2] = value;
    lVar2 = lVar2 + 1;
  }
  return;
}

Assistant:

void
class6(int *ip)
{
	int	i;
	int addr[3];

	/* update location counter */
	loccnt +=7;

	/* get operands */
    for (i = 0; i < 3; i++) {
		if (!evaluate(ip, (i < 2) ? ',' : ';'))
			return;
		if (pass == LAST_PASS) {
			if (value & 0xFFFF0000) {
				error("Operand size error!");
				return;
			}
		}
	    addr[i] = value;
	}

	/* generate code */
	if (pass == LAST_PASS) {
		/* opcodes */
		putbyte(data_loccnt, opval);
		putword(data_loccnt+1, addr[0]);
		putword(data_loccnt+3, addr[1]);
		putword(data_loccnt+5, addr[2]);

		/* output line */
		println();
	}
}